

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *pRVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 (*pauVar19) [16];
  long lVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  vint4 bi;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  vint4 ai_1;
  undefined1 auVar72 [16];
  undefined4 uVar73;
  float fVar74;
  float fVar76;
  float fVar77;
  vint4 ai;
  undefined1 auVar75 [16];
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  uint uVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  byte local_12a8;
  int local_1284;
  ulong local_1280;
  ulong local_1278;
  ulong local_1270;
  long local_1268;
  RayQueryContext *local_1260;
  Scene *local_1258;
  RTCFilterFunctionNArguments local_1250;
  float local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  uint local_1208;
  uint local_1204;
  uint local_1200;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  byte local_109f;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 != 8) {
    local_1260 = context;
    pauVar29 = (undefined1 (*) [16])local_f90;
    uStack_f98 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar38 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    auVar34 = vandps_avx512vl((undefined1  [16])aVar2,auVar34);
    auVar80._8_4_ = 0x219392ef;
    auVar80._0_8_ = 0x219392ef219392ef;
    auVar80._12_4_ = 0x219392ef;
    uVar24 = vcmpps_avx512vl(auVar34,auVar80,1);
    bVar5 = (bool)((byte)uVar24 & 1);
    auVar36._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.x;
    bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.y;
    bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.z;
    bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * aVar2.field_3.a;
    auVar34 = vrcp14ps_avx512vl(auVar36);
    auVar35._8_4_ = 0x3f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar35 = vfnmadd213ps_avx512vl(auVar36,auVar34,auVar35);
    auVar71 = vfmadd132ps_fma(auVar35,auVar34,auVar34);
    auVar34 = vbroadcastss_avx512vl(auVar71);
    auVar94 = ZEXT1664(auVar34);
    auVar34 = vmovshdup_avx(auVar71);
    auVar35 = vshufps_avx512vl(auVar71,auVar71,0x55);
    auVar95 = ZEXT1664(auVar35);
    auVar35 = vshufpd_avx(auVar71,auVar71,1);
    auVar36 = vshufps_avx512vl(auVar71,auVar71,0xaa);
    auVar96 = ZEXT1664(auVar36);
    auVar67._0_4_ = auVar71._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar67._4_4_ = auVar71._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar67._8_4_ = auVar71._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar67._12_4_ = auVar71._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar81._4_4_ = auVar67._0_4_;
    auVar81._0_4_ = auVar67._0_4_;
    auVar81._8_4_ = auVar67._0_4_;
    auVar81._12_4_ = auVar67._0_4_;
    auVar36 = vshufps_avx(auVar67,auVar67,0x55);
    auVar67 = vshufps_avx(auVar67,auVar67,0xaa);
    local_1270 = (ulong)(auVar71._0_4_ < 0.0) << 4;
    local_1278 = (ulong)(auVar34._0_4_ < 0.0) << 4 | 0x20;
    local_1280 = (ulong)(auVar35._0_4_ < 0.0) << 4 | 0x40;
    uVar28 = local_1270 ^ 0x10;
    uVar31 = local_1278 ^ 0x10;
    uVar24 = local_1280 ^ 0x10;
    uVar73 = auVar37._0_4_;
    auVar70 = ZEXT1664(CONCAT412(uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73))));
    auVar71._8_4_ = 0x80000000;
    auVar71._0_8_ = 0x8000000080000000;
    auVar71._12_4_ = 0x80000000;
    auVar37 = vxorps_avx512vl(auVar81,auVar71);
    auVar97 = ZEXT1664(auVar37);
    auVar37 = vxorps_avx512vl(auVar36,auVar71);
    auVar98 = ZEXT1664(auVar37);
    auVar37 = vxorps_avx512vl(auVar67,auVar71);
    auVar99 = ZEXT1664(auVar37);
    auVar38 = vbroadcastss_avx512vl(auVar38);
    auVar100 = ZEXT1664(auVar38);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar101 = ZEXT3264(auVar52);
    auVar52 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
    auVar102 = ZEXT3264(auVar52);
    auVar38 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar103 = ZEXT1664(auVar38);
    auVar104 = ZEXT3264(_DAT_01fbac00);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar105 = ZEXT3264(auVar52);
LAB_01bdd60d:
    if (pauVar29 != (undefined1 (*) [16])&local_fa0) {
      pauVar19 = pauVar29 + -1;
      pauVar29 = pauVar29 + -1;
      if (*(float *)((long)*pauVar19 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar33 = *(ulong *)*pauVar29;
        while ((uVar33 & 8) == 0) {
          auVar38 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + local_1270),auVar97._0_16_,
                               auVar94._0_16_);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + local_1278),auVar98._0_16_,
                               auVar95._0_16_);
          auVar38 = vpmaxsd_avx(auVar38,auVar37);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + local_1280),auVar99._0_16_,
                               auVar96._0_16_);
          auVar37 = vpmaxsd_avx512vl(auVar37,auVar100._0_16_);
          auVar38 = vpmaxsd_avx(auVar38,auVar37);
          auVar37 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + uVar28),auVar97._0_16_,
                               auVar94._0_16_);
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + uVar31),auVar98._0_16_,
                               auVar95._0_16_);
          auVar37 = vpminsd_avx(auVar37,auVar34);
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(uVar33 + 0x20 + uVar24),auVar99._0_16_,
                               auVar96._0_16_);
          auVar34 = vpminsd_avx(auVar34,auVar70._0_16_);
          auVar37 = vpminsd_avx(auVar37,auVar34);
          uVar32 = vpcmpd_avx512vl(auVar38,auVar37,2);
          uVar32 = uVar32 & 0xf;
          local_1120._0_16_ = auVar38;
          if ((char)uVar32 == '\0') goto LAB_01bdd60d;
          uVar30 = uVar33 & 0xfffffffffffffff0;
          lVar27 = 0;
          for (uVar33 = uVar32; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar33 = *(ulong *)(uVar30 + lVar27 * 8);
          uVar21 = (uint)uVar32 - 1 & (uint)uVar32;
          uVar32 = (ulong)uVar21;
          if (uVar21 != 0) {
            uVar22 = *(uint *)(local_1120 + lVar27 * 4);
            lVar27 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar23 = (ulong)uVar21;
            uVar32 = *(ulong *)(uVar30 + lVar27 * 8);
            uVar87 = *(uint *)(local_1120 + lVar27 * 4);
            if (uVar21 == 0) {
              if (uVar22 < uVar87) {
                *(ulong *)*pauVar29 = uVar32;
                *(uint *)((long)*pauVar29 + 8) = uVar87;
                pauVar29 = pauVar29 + 1;
              }
              else {
                *(ulong *)*pauVar29 = uVar33;
                *(uint *)((long)*pauVar29 + 8) = uVar22;
                pauVar29 = pauVar29 + 1;
                uVar33 = uVar32;
              }
            }
            else {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar33;
              auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar22));
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar32;
              auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar87));
              lVar27 = 0;
              for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                lVar27 = lVar27 + 1;
              }
              uVar21 = uVar21 - 1 & uVar21;
              uVar33 = (ulong)uVar21;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = *(ulong *)(uVar30 + lVar27 * 8);
              auVar67 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_1120 + lVar27 * 4)));
              auVar34 = vpshufd_avx(auVar38,0xaa);
              auVar35 = vpshufd_avx(auVar37,0xaa);
              auVar36 = vpshufd_avx(auVar67,0xaa);
              if (uVar21 == 0) {
                uVar33 = vpcmpgtd_avx512vl(auVar35,auVar34);
                uVar33 = uVar33 & 0xf;
                auVar35 = vpblendmd_avx512vl(auVar37,auVar38);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar39._0_4_ = (uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * auVar34._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar39._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar34._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar39._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar34._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar39._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar34._12_4_;
                auVar37 = vmovdqa32_avx512vl(auVar37);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar40._0_4_ = (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar40._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar38._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar40._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar38._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar40._12_4_ = (uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar38._12_4_;
                auVar38 = vpshufd_avx(auVar39,0xaa);
                uVar32 = vpcmpgtd_avx512vl(auVar36,auVar38);
                uVar32 = uVar32 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar67,auVar39);
                bVar5 = (bool)((byte)uVar32 & 1);
                bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                uVar33 = CONCAT44((uint)bVar6 * auVar37._4_4_ | (uint)!bVar6 * auVar38._4_4_,
                                  (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_);
                auVar38 = vmovdqa32_avx512vl(auVar67);
                bVar5 = (bool)((byte)uVar32 & 1);
                auVar41._0_4_ = (uint)bVar5 * auVar38._0_4_ | !bVar5 * auVar39._0_4_;
                bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar5 * auVar38._4_4_ | !bVar5 * auVar39._4_4_;
                bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar5 * auVar38._8_4_ | !bVar5 * auVar39._8_4_;
                bVar5 = SUB81(uVar32 >> 3,0);
                auVar41._12_4_ = (uint)bVar5 * auVar38._12_4_ | !bVar5 * auVar39._12_4_;
                auVar38 = vpshufd_avx(auVar41,0xaa);
                auVar37 = vpshufd_avx(auVar40,0xaa);
                uVar32 = vpcmpgtd_avx512vl(auVar38,auVar37);
                uVar32 = uVar32 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar41,auVar40);
                bVar5 = (bool)((byte)uVar32 & 1);
                auVar42._0_4_ = (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_;
                bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar38._4_4_;
                bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar38._8_4_;
                bVar5 = SUB81(uVar32 >> 3,0);
                auVar42._12_4_ = (uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar38._12_4_;
                auVar38 = vmovdqa32_avx512vl(auVar41);
                bVar5 = (bool)((byte)uVar32 & 1);
                auVar43._0_4_ = (uint)bVar5 * auVar38._0_4_ | !bVar5 * auVar40._0_4_;
                bVar5 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar5 * auVar38._4_4_ | !bVar5 * auVar40._4_4_;
                bVar5 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar5 * auVar38._8_4_ | !bVar5 * auVar40._8_4_;
                bVar5 = SUB81(uVar32 >> 3,0);
                auVar43._12_4_ = (uint)bVar5 * auVar38._12_4_ | !bVar5 * auVar40._12_4_;
                *pauVar29 = auVar43;
                pauVar29[1] = auVar42;
                pauVar29 = pauVar29 + 2;
              }
              else {
                lVar27 = 0;
                for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                  lVar27 = lVar27 + 1;
                }
                uVar21 = *(uint *)(local_1120 + lVar27 * 4);
                auVar82._8_8_ = 0;
                auVar82._0_8_ = *(ulong *)(uVar30 + lVar27 * 8);
                auVar71 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar21));
                uVar33 = vpcmpgtd_avx512vl(auVar35,auVar34);
                uVar33 = uVar33 & 0xf;
                auVar35 = vpblendmd_avx512vl(auVar37,auVar38);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar44._0_4_ = (uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * auVar34._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar5 * auVar35._4_4_ | (uint)!bVar5 * auVar34._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar5 * auVar35._8_4_ | (uint)!bVar5 * auVar34._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar44._12_4_ = (uint)bVar5 * auVar35._12_4_ | (uint)!bVar5 * auVar34._12_4_;
                auVar37 = vmovdqa32_avx512vl(auVar37);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar45._0_4_ = (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar38._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar38._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar45._12_4_ = (uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar38._12_4_;
                auVar75._4_4_ = uVar21;
                auVar75._0_4_ = uVar21;
                auVar75._8_4_ = uVar21;
                auVar75._12_4_ = uVar21;
                uVar33 = vpcmpgtd_avx512vl(auVar75,auVar36);
                uVar33 = uVar33 & 0xf;
                auVar38 = vpblendmd_avx512vl(auVar71,auVar67);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar46._0_4_ = (uint)bVar5 * auVar38._0_4_ | !bVar5 * uVar21;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar5 * auVar38._4_4_ | !bVar5 * uVar21;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar5 * auVar38._8_4_ | !bVar5 * uVar21;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar46._12_4_ = (uint)bVar5 * auVar38._12_4_ | !bVar5 * uVar21;
                auVar38 = vmovdqa32_avx512vl(auVar71);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar47._0_4_ = (uint)bVar5 * auVar38._0_4_ | (uint)!bVar5 * auVar67._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar5 * auVar38._4_4_ | (uint)!bVar5 * auVar67._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar5 * auVar38._8_4_ | (uint)!bVar5 * auVar67._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar47._12_4_ = (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * auVar67._12_4_;
                auVar38 = vpshufd_avx(auVar47,0xaa);
                auVar37 = vpshufd_avx(auVar45,0xaa);
                uVar33 = vpcmpgtd_avx512vl(auVar38,auVar37);
                uVar33 = uVar33 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar47,auVar45);
                bVar5 = (bool)((byte)uVar33 & 1);
                auVar48._0_4_ = (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar38._0_4_;
                bVar5 = (bool)((byte)(uVar33 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar38._4_4_;
                bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar38._8_4_;
                bVar5 = SUB81(uVar33 >> 3,0);
                auVar48._12_4_ = (uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar38._12_4_;
                auVar34 = vmovdqa32_avx512vl(auVar47);
                bVar5 = (bool)((byte)uVar33 & 1);
                bVar7 = (bool)((byte)(uVar33 >> 1) & 1);
                bVar9 = (bool)((byte)(uVar33 >> 2) & 1);
                bVar10 = SUB81(uVar33 >> 3,0);
                auVar38 = vpshufd_avx(auVar46,0xaa);
                auVar37 = vpshufd_avx(auVar44,0xaa);
                uVar32 = vpcmpgtd_avx512vl(auVar38,auVar37);
                uVar32 = uVar32 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar46,auVar44);
                bVar6 = (bool)((byte)uVar32 & 1);
                bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
                uVar33 = CONCAT44((uint)bVar8 * auVar37._4_4_ | (uint)!bVar8 * auVar38._4_4_,
                                  (uint)bVar6 * auVar37._0_4_ | (uint)!bVar6 * auVar38._0_4_);
                auVar38 = vmovdqa32_avx512vl(auVar46);
                bVar6 = (bool)((byte)uVar32 & 1);
                auVar49._0_4_ = (uint)bVar6 * auVar38._0_4_ | !bVar6 * auVar44._0_4_;
                bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar6 * auVar38._4_4_ | !bVar6 * auVar44._4_4_;
                bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar6 * auVar38._8_4_ | !bVar6 * auVar44._8_4_;
                bVar6 = SUB81(uVar32 >> 3,0);
                auVar49._12_4_ = (uint)bVar6 * auVar38._12_4_ | !bVar6 * auVar44._12_4_;
                auVar38 = vpshufd_avx(auVar49,0xaa);
                auVar37 = vpshufd_avx(auVar48,0xaa);
                uVar32 = vpcmpgtd_avx512vl(auVar37,auVar38);
                uVar32 = uVar32 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar48,auVar49);
                bVar6 = (bool)((byte)uVar32 & 1);
                auVar50._0_4_ = (uint)bVar6 * auVar37._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar50._4_4_ = (uint)bVar6 * auVar37._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar50._8_4_ = (uint)bVar6 * auVar37._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar32 >> 3,0);
                auVar50._12_4_ = (uint)bVar6 * auVar37._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar38 = vmovdqa32_avx512vl(auVar48);
                bVar6 = (bool)((byte)uVar32 & 1);
                auVar51._0_4_ = (uint)bVar6 * auVar38._0_4_ | !bVar6 * auVar49._0_4_;
                bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar51._4_4_ = (uint)bVar6 * auVar38._4_4_ | !bVar6 * auVar49._4_4_;
                bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar51._8_4_ = (uint)bVar6 * auVar38._8_4_ | !bVar6 * auVar49._8_4_;
                bVar6 = SUB81(uVar32 >> 3,0);
                auVar51._12_4_ = (uint)bVar6 * auVar38._12_4_ | !bVar6 * auVar49._12_4_;
                *(uint *)*pauVar29 = (uint)bVar5 * auVar34._0_4_ | !bVar5 * auVar45._0_4_;
                *(uint *)((long)*pauVar29 + 4) =
                     (uint)bVar7 * auVar34._4_4_ | !bVar7 * auVar45._4_4_;
                *(uint *)((long)*pauVar29 + 8) =
                     (uint)bVar9 * auVar34._8_4_ | !bVar9 * auVar45._8_4_;
                *(uint *)((long)*pauVar29 + 0xc) =
                     (uint)bVar10 * auVar34._12_4_ | !bVar10 * auVar45._12_4_;
                pauVar29[1] = auVar51;
                pauVar29[2] = auVar50;
                pauVar29 = pauVar29 + 3;
              }
            }
          }
        }
        local_1268 = (ulong)((uint)uVar33 & 0xf) - 8;
        uVar33 = uVar33 & 0xfffffffffffffff0;
        for (lVar27 = 0; lVar27 != local_1268; lVar27 = lVar27 + 1) {
          lVar20 = lVar27 * 0xe0;
          lVar1 = uVar33 + 0xd0 + lVar20;
          local_1140 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1138 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar33 + 0xc0 + lVar20;
          local_fc0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          uStack_1130 = local_1140;
          uStack_1128 = uStack_1138;
          auVar59._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar20);
          auVar59._0_16_ = *(undefined1 (*) [16])(uVar33 + lVar20);
          auVar60._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar20);
          auVar60._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x10 + lVar20);
          auVar83._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar20);
          auVar83._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x20 + lVar20);
          auVar38 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar20);
          auVar52._16_16_ = auVar38;
          auVar52._0_16_ = auVar38;
          auVar37 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar20);
          auVar64._16_16_ = auVar37;
          auVar64._0_16_ = auVar37;
          auVar34 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar20);
          auVar63._16_16_ = auVar34;
          auVar63._0_16_ = auVar34;
          auVar35 = *(undefined1 (*) [16])(uVar33 + 0x90 + lVar20);
          auVar79._16_16_ = auVar35;
          auVar79._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar33 + 0xa0 + lVar20);
          auVar62._16_16_ = auVar35;
          auVar62._0_16_ = auVar35;
          auVar35 = *(undefined1 (*) [16])(uVar33 + 0xb0 + lVar20);
          auVar85._16_16_ = auVar35;
          auVar85._0_16_ = auVar35;
          auVar52 = vsubps_avx(auVar59,auVar52);
          auVar64 = vsubps_avx(auVar60,auVar64);
          auVar63 = vsubps_avx(auVar83,auVar63);
          auVar79 = vsubps_avx(auVar79,auVar59);
          auVar62 = vsubps_avx(auVar62,auVar60);
          auVar61 = vsubps_avx(auVar85,auVar83);
          auVar53._4_4_ = auVar64._4_4_ * auVar61._4_4_;
          auVar53._0_4_ = auVar64._0_4_ * auVar61._0_4_;
          auVar53._8_4_ = auVar64._8_4_ * auVar61._8_4_;
          auVar53._12_4_ = auVar64._12_4_ * auVar61._12_4_;
          auVar53._16_4_ = auVar64._16_4_ * auVar61._16_4_;
          auVar53._20_4_ = auVar64._20_4_ * auVar61._20_4_;
          auVar53._24_4_ = auVar64._24_4_ * auVar61._24_4_;
          auVar53._28_4_ = auVar38._12_4_;
          auVar35 = vfmsub231ps_fma(auVar53,auVar62,auVar63);
          auVar54._4_4_ = auVar63._4_4_ * auVar79._4_4_;
          auVar54._0_4_ = auVar63._0_4_ * auVar79._0_4_;
          auVar54._8_4_ = auVar63._8_4_ * auVar79._8_4_;
          auVar54._12_4_ = auVar63._12_4_ * auVar79._12_4_;
          auVar54._16_4_ = auVar63._16_4_ * auVar79._16_4_;
          auVar54._20_4_ = auVar63._20_4_ * auVar79._20_4_;
          auVar54._24_4_ = auVar63._24_4_ * auVar79._24_4_;
          auVar54._28_4_ = auVar37._12_4_;
          auVar37 = vfmsub231ps_fma(auVar54,auVar61,auVar52);
          auVar58._4_4_ = auVar52._4_4_ * auVar62._4_4_;
          auVar58._0_4_ = auVar52._0_4_ * auVar62._0_4_;
          auVar58._8_4_ = auVar52._8_4_ * auVar62._8_4_;
          auVar58._12_4_ = auVar52._12_4_ * auVar62._12_4_;
          auVar58._16_4_ = auVar52._16_4_ * auVar62._16_4_;
          auVar58._20_4_ = auVar52._20_4_ * auVar62._20_4_;
          auVar58._24_4_ = auVar52._24_4_ * auVar62._24_4_;
          auVar58._28_4_ = auVar34._12_4_;
          uVar73 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar93._4_4_ = uVar73;
          auVar93._0_4_ = uVar73;
          auVar93._8_4_ = uVar73;
          auVar93._12_4_ = uVar73;
          auVar93._16_4_ = uVar73;
          auVar93._20_4_ = uVar73;
          auVar93._24_4_ = uVar73;
          auVar93._28_4_ = uVar73;
          auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
          auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
          uVar73 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar55._4_4_ = uVar73;
          auVar55._0_4_ = uVar73;
          auVar55._8_4_ = uVar73;
          auVar55._12_4_ = uVar73;
          auVar55._16_4_ = uVar73;
          auVar55._20_4_ = uVar73;
          auVar55._24_4_ = uVar73;
          auVar55._28_4_ = uVar73;
          auVar55 = vsubps_avx512vl(auVar59,auVar55);
          auVar34 = vfmsub231ps_fma(auVar58,auVar79,auVar64);
          uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar56._4_4_ = uVar73;
          auVar56._0_4_ = uVar73;
          auVar56._8_4_ = uVar73;
          auVar56._12_4_ = uVar73;
          auVar56._16_4_ = uVar73;
          auVar56._20_4_ = uVar73;
          auVar56._24_4_ = uVar73;
          auVar56._28_4_ = uVar73;
          auVar56 = vsubps_avx512vl(auVar60,auVar56);
          uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar57._4_4_ = uVar73;
          auVar57._0_4_ = uVar73;
          auVar57._8_4_ = uVar73;
          auVar57._12_4_ = uVar73;
          auVar57._16_4_ = uVar73;
          auVar57._20_4_ = uVar73;
          auVar57._24_4_ = uVar73;
          auVar57._28_4_ = uVar73;
          auVar57 = vsubps_avx512vl(auVar83,auVar57);
          auVar58 = vmulps_avx512vl(auVar53,auVar57);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar56,auVar54);
          auVar59 = vmulps_avx512vl(auVar54,auVar55);
          auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar93);
          auVar60 = vmulps_avx512vl(auVar93,auVar56);
          auVar60 = vfmsub231ps_avx512vl(auVar60,auVar55,auVar53);
          auVar54 = vmulps_avx512vl(ZEXT1632(auVar34),auVar54);
          auVar53 = vfmadd231ps_avx512vl(auVar54,ZEXT1632(auVar37),auVar53);
          local_10c0 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar35),auVar93);
          vandps_avx512vl(local_10c0,auVar101._0_32_);
          auVar61 = vmulps_avx512vl(auVar61,auVar60);
          auVar62 = vfmadd231ps_avx512vl(auVar61,auVar59,auVar62);
          auVar38 = vfmadd231ps_fma(auVar62,auVar58,auVar79);
          vandps_avx512vl(local_10c0,auVar102._0_32_);
          uVar21 = auVar62._0_4_;
          auVar61._0_4_ = (float)(uVar21 ^ auVar38._0_4_);
          uVar22 = auVar62._4_4_;
          auVar61._4_4_ = (float)(uVar22 ^ auVar38._4_4_);
          uVar87 = auVar62._8_4_;
          auVar61._8_4_ = (float)(uVar87 ^ auVar38._8_4_);
          uVar26 = auVar62._12_4_;
          auVar61._12_4_ = (float)(uVar26 ^ auVar38._12_4_);
          fVar88 = auVar62._16_4_;
          auVar61._16_4_ = fVar88;
          fVar89 = auVar62._20_4_;
          auVar61._20_4_ = fVar89;
          fVar90 = auVar62._24_4_;
          auVar61._24_4_ = fVar90;
          fVar91 = auVar62._28_4_;
          auVar61._28_4_ = fVar91;
          auVar63 = vmulps_avx512vl(auVar63,auVar60);
          auVar64 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar59);
          auVar38 = vfmadd231ps_fma(auVar64,auVar52,auVar58);
          auVar84._0_4_ = (float)(uVar21 ^ auVar38._0_4_);
          auVar84._4_4_ = (float)(uVar22 ^ auVar38._4_4_);
          auVar84._8_4_ = (float)(uVar87 ^ auVar38._8_4_);
          auVar84._12_4_ = (float)(uVar26 ^ auVar38._12_4_);
          auVar84._16_4_ = fVar88;
          auVar84._20_4_ = fVar89;
          auVar84._24_4_ = fVar90;
          auVar84._28_4_ = fVar91;
          auVar52 = auVar103._0_32_;
          uVar11 = vcmpps_avx512vl(auVar61,auVar52,5);
          uVar12 = vcmpps_avx512vl(auVar84,auVar52,5);
          uVar13 = vcmpps_avx512vl(local_10c0,auVar52,4);
          auVar92._0_4_ = auVar61._0_4_ + auVar84._0_4_;
          auVar92._4_4_ = auVar61._4_4_ + auVar84._4_4_;
          auVar92._8_4_ = auVar61._8_4_ + auVar84._8_4_;
          auVar92._12_4_ = auVar61._12_4_ + auVar84._12_4_;
          auVar92._16_4_ = fVar88 + fVar88;
          auVar92._20_4_ = fVar89 + fVar89;
          auVar92._24_4_ = fVar90 + fVar90;
          auVar92._28_4_ = fVar91 + fVar91;
          uVar14 = vcmpps_avx512vl(auVar92,local_10c0,2);
          local_109f = (byte)uVar11 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
          if (local_109f != 0) {
            auVar18._4_4_ = auVar57._4_4_ * auVar34._4_4_;
            auVar18._0_4_ = auVar57._0_4_ * auVar34._0_4_;
            auVar18._8_4_ = auVar57._8_4_ * auVar34._8_4_;
            auVar18._12_4_ = auVar57._12_4_ * auVar34._12_4_;
            auVar18._16_4_ = auVar57._16_4_ * 0.0;
            auVar18._20_4_ = auVar57._20_4_ * 0.0;
            auVar18._24_4_ = auVar57._24_4_ * 0.0;
            auVar18._28_4_ = auVar57._28_4_;
            auVar38 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar37),auVar18);
            auVar38 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar35),ZEXT1632(auVar38));
            local_10e0._0_4_ = (float)(uVar21 ^ auVar38._0_4_);
            local_10e0._4_4_ = (float)(uVar22 ^ auVar38._4_4_);
            local_10e0._8_4_ = (float)(uVar87 ^ auVar38._8_4_);
            local_10e0._12_4_ = (float)(uVar26 ^ auVar38._12_4_);
            local_10e0._16_4_ = fVar88;
            local_10e0._20_4_ = fVar89;
            local_10e0._24_4_ = fVar90;
            local_10e0._28_4_ = fVar91;
            uVar73 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar15._4_4_ = uVar73;
            auVar15._0_4_ = uVar73;
            auVar15._8_4_ = uVar73;
            auVar15._12_4_ = uVar73;
            auVar15._16_4_ = uVar73;
            auVar15._20_4_ = uVar73;
            auVar15._24_4_ = uVar73;
            auVar15._28_4_ = uVar73;
            auVar52 = vmulps_avx512vl(local_10c0,auVar15);
            uVar11 = vcmpps_avx512vl(auVar52,local_10e0,1);
            fVar74 = (ray->super_RayK<1>).tfar;
            auVar16._4_4_ = fVar74;
            auVar16._0_4_ = fVar74;
            auVar16._8_4_ = fVar74;
            auVar16._12_4_ = fVar74;
            auVar16._16_4_ = fVar74;
            auVar16._20_4_ = fVar74;
            auVar16._24_4_ = fVar74;
            auVar16._28_4_ = fVar74;
            auVar52 = vmulps_avx512vl(local_10c0,auVar16);
            uVar12 = vcmpps_avx512vl(local_10e0,auVar52,2);
            local_109f = (byte)uVar11 & (byte)uVar12 & local_109f;
            if (local_109f != 0) {
              auVar52 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar86 = ZEXT3264(auVar52);
              uVar21 = vextractps_avx(auVar52._0_16_,1);
              auVar52 = vsubps_avx(local_10c0,auVar84);
              local_1120 = vblendps_avx(auVar61,auVar52,0xf0);
              auVar52 = vsubps_avx(local_10c0,auVar61);
              local_1100 = vblendps_avx(auVar84,auVar52,0xf0);
              auVar52 = auVar104._0_32_;
              local_1020 = vmulps_avx512vl(ZEXT1632(auVar35),auVar52);
              local_1000 = vmulps_avx512vl(ZEXT1632(auVar37),auVar52);
              local_fe0 = vmulps_avx512vl(ZEXT1632(auVar34),auVar52);
              auVar52 = vrcp14ps_avx512vl(local_10c0);
              auVar64 = vfnmadd213ps_avx512vl(local_10c0,auVar52,auVar105._0_32_);
              auVar38 = vfmadd132ps_fma(auVar64,auVar52,auVar52);
              fVar74 = auVar38._0_4_;
              fVar76 = auVar38._4_4_;
              local_1040._4_4_ = fVar76 * local_10e0._4_4_;
              local_1040._0_4_ = fVar74 * local_10e0._0_4_;
              fVar77 = auVar38._8_4_;
              local_1040._8_4_ = fVar77 * local_10e0._8_4_;
              fVar78 = auVar38._12_4_;
              local_1040._12_4_ = fVar78 * local_10e0._12_4_;
              local_1040._16_4_ = fVar88 * 0.0;
              local_1040._20_4_ = fVar89 * 0.0;
              local_1040._24_4_ = fVar90 * 0.0;
              local_1040._28_4_ = fVar91;
              auVar70 = ZEXT3264(local_1040);
              local_1080[0] = local_1120._0_4_ * fVar74;
              local_1080[1] = local_1120._4_4_ * fVar76;
              local_1080[2] = local_1120._8_4_ * fVar77;
              local_1080[3] = local_1120._12_4_ * fVar78;
              fStack_1070 = local_1120._16_4_ * 0.0;
              fStack_106c = local_1120._20_4_ * 0.0;
              fStack_1068 = local_1120._24_4_ * 0.0;
              uStack_1064 = auVar52._28_4_;
              local_1060[0] = local_1100._0_4_ * fVar74;
              local_1060[1] = local_1100._4_4_ * fVar76;
              local_1060[2] = local_1100._8_4_ * fVar77;
              local_1060[3] = local_1100._12_4_ * fVar78;
              fStack_1050 = local_1100._16_4_ * 0.0;
              fStack_104c = local_1100._20_4_ * 0.0;
              fStack_1048 = local_1100._24_4_ * 0.0;
              uStack_1044 = auVar52._28_4_;
              auVar68._8_4_ = 0x7f800000;
              auVar68._0_8_ = 0x7f8000007f800000;
              auVar68._12_4_ = 0x7f800000;
              auVar68._16_4_ = 0x7f800000;
              auVar68._20_4_ = 0x7f800000;
              auVar68._24_4_ = 0x7f800000;
              auVar68._28_4_ = 0x7f800000;
              auVar52 = vblendmps_avx512vl(auVar68,local_1040);
              auVar65._0_4_ =
                   (uint)(local_109f & 1) * auVar52._0_4_ |
                   (uint)!(bool)(local_109f & 1) * 0x7f800000;
              bVar5 = (bool)(local_109f >> 1 & 1);
              auVar65._4_4_ = (uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(local_109f >> 2 & 1);
              auVar65._8_4_ = (uint)bVar5 * auVar52._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(local_109f >> 3 & 1);
              auVar65._12_4_ = (uint)bVar5 * auVar52._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(local_109f >> 4 & 1);
              auVar65._16_4_ = (uint)bVar5 * auVar52._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(local_109f >> 5 & 1);
              auVar65._20_4_ = (uint)bVar5 * auVar52._20_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(local_109f >> 6 & 1);
              auVar65._24_4_ = (uint)bVar5 * auVar52._24_4_ | (uint)!bVar5 * 0x7f800000;
              auVar65._28_4_ =
                   (uint)(local_109f >> 7) * auVar52._28_4_ |
                   (uint)!(bool)(local_109f >> 7) * 0x7f800000;
              auVar52 = vshufps_avx(auVar65,auVar65,0xb1);
              auVar52 = vminps_avx(auVar65,auVar52);
              auVar64 = vshufpd_avx(auVar52,auVar52,5);
              auVar52 = vminps_avx(auVar52,auVar64);
              auVar64 = vpermpd_avx2(auVar52,0x4e);
              auVar52 = vminps_avx(auVar52,auVar64);
              uVar11 = vcmpps_avx512vl(auVar65,auVar52,0);
              uVar22 = (uint)local_109f;
              bVar25 = local_109f;
              if ((local_109f & (byte)uVar11) != 0) {
                bVar25 = local_109f & (byte)uVar11;
              }
              uVar87 = 0;
              for (uVar26 = (uint)bVar25; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                uVar87 = uVar87 + 1;
              }
              local_1258 = local_1260->scene;
              do {
                auVar38 = auVar103._0_16_;
                uVar26 = uVar87 & 0xff;
                local_1208 = *(uint *)((long)&local_fc0 + (ulong)uVar26 * 4);
                pGVar3 = (local_1258->geometries).items[local_1208].ptr;
                local_12a8 = (byte)uVar22;
                if ((pGVar3->mask & uVar21) == 0) {
                  uVar22 = (uint)(~(byte)(1 << (uVar87 & 0x1f)) & local_12a8);
                }
                else {
                  pRVar4 = local_1260->args;
                  local_1180 = auVar86._0_32_;
                  local_1160 = auVar70._0_32_;
                  local_11f0 = auVar100._0_16_;
                  local_11e0 = auVar99._0_16_;
                  local_11d0 = auVar98._0_16_;
                  local_11c0 = auVar97._0_16_;
                  local_11b0 = auVar96._0_16_;
                  local_11a0 = auVar95._0_16_;
                  local_1190 = auVar94._0_16_;
                  if (pRVar4->filter == (RTCFilterFunctionN)0x0) {
                    local_1250.context = local_1260->user;
                    if (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar32 = (ulong)(uVar26 << 2);
                      fVar88 = *(float *)((long)local_1080 + uVar32);
                      fVar89 = *(float *)((long)local_1060 + uVar32);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1040 + uVar32);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1020 + uVar32);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1000 + uVar32);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_fe0 + uVar32);
                      ray->u = fVar88;
                      ray->v = fVar89;
                      ray->primID = *(uint *)((long)&local_1140 + uVar32);
                      ray->geomID = local_1208;
                      ray->instID[0] = (local_1250.context)->instID[0];
                      ray->instPrimID[0] = (local_1250.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    local_1250.context = local_1260->user;
                  }
                  uVar32 = (ulong)(uVar26 * 4);
                  local_1220 = *(float *)(local_1020 + uVar32);
                  local_121c = *(undefined4 *)(local_1000 + uVar32);
                  local_1218 = *(undefined4 *)(local_fe0 + uVar32);
                  local_1214 = *(undefined4 *)((long)local_1080 + uVar32);
                  local_1210 = *(undefined4 *)((long)local_1060 + uVar32);
                  local_120c = *(undefined4 *)((long)&local_1140 + uVar32);
                  local_1204 = (local_1250.context)->instID[0];
                  local_1200 = (local_1250.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_1040 + uVar32);
                  local_1284 = -1;
                  local_1250.valid = &local_1284;
                  local_1250.geometryUserPtr = pGVar3->userPtr;
                  local_1250.ray = (RTCRayN *)ray;
                  local_1250.hit = (RTCHitN *)&local_1220;
                  local_1250.N = 1;
                  if (((pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*pGVar3->intersectionFilterN)(&local_1250), *local_1250.valid != 0)) &&
                     ((pRVar4->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((pGVar3->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar4->filter)(&local_1250), *local_1250.valid != 0)))))) {
                    (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_1250.hit;
                    (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_1250.hit + 4);
                    (((Vec3f *)((long)local_1250.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_1250.hit + 8);
                    *(float *)((long)local_1250.ray + 0x3c) = *(float *)(local_1250.hit + 0xc);
                    *(float *)((long)local_1250.ray + 0x40) = *(float *)(local_1250.hit + 0x10);
                    *(float *)((long)local_1250.ray + 0x44) = *(float *)(local_1250.hit + 0x14);
                    *(float *)((long)local_1250.ray + 0x48) = *(float *)(local_1250.hit + 0x18);
                    *(float *)((long)local_1250.ray + 0x4c) = *(float *)(local_1250.hit + 0x1c);
                    *(float *)((long)local_1250.ray + 0x50) = *(float *)(local_1250.hit + 0x20);
                  }
                  else {
                    (ray->super_RayK<1>).tfar = (float)local_1180._0_4_;
                  }
                  auVar70 = ZEXT3264(local_1160);
                  fVar88 = (ray->super_RayK<1>).tfar;
                  auVar17._4_4_ = fVar88;
                  auVar17._0_4_ = fVar88;
                  auVar17._8_4_ = fVar88;
                  auVar17._12_4_ = fVar88;
                  auVar17._16_4_ = fVar88;
                  auVar17._20_4_ = fVar88;
                  auVar17._24_4_ = fVar88;
                  auVar17._28_4_ = fVar88;
                  uVar11 = vcmpps_avx512vl(local_1160,auVar17,2);
                  uVar22 = (uint)(~(byte)(1 << (uVar87 & 0x1f)) & local_12a8) & (uint)uVar11;
                  uVar21 = (ray->super_RayK<1>).mask;
                  auVar86 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                  auVar94 = ZEXT1664(local_1190);
                  auVar95 = ZEXT1664(local_11a0);
                  auVar96 = ZEXT1664(local_11b0);
                  auVar97 = ZEXT1664(local_11c0);
                  auVar98 = ZEXT1664(local_11d0);
                  auVar99 = ZEXT1664(local_11e0);
                  auVar100 = ZEXT1664(local_11f0);
                  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar101 = ZEXT3264(auVar52);
                  auVar52 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
                  auVar102 = ZEXT3264(auVar52);
                  auVar38 = vxorps_avx512vl(auVar38,auVar38);
                  auVar103 = ZEXT1664(auVar38);
                  auVar104 = ZEXT3264(_DAT_01fbac00);
                  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar105 = ZEXT3264(auVar52);
                }
                bVar25 = (byte)uVar22;
                if (bVar25 == 0) break;
                auVar69._8_4_ = 0x7f800000;
                auVar69._0_8_ = 0x7f8000007f800000;
                auVar69._12_4_ = 0x7f800000;
                auVar69._16_4_ = 0x7f800000;
                auVar69._20_4_ = 0x7f800000;
                auVar69._24_4_ = 0x7f800000;
                auVar69._28_4_ = 0x7f800000;
                auVar52 = vblendmps_avx512vl(auVar69,auVar70._0_32_);
                auVar66._0_4_ =
                     (uint)(bVar25 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar5 * auVar52._8_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
                auVar66._12_4_ = (uint)bVar5 * auVar52._12_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 4) & 1);
                auVar66._16_4_ = (uint)bVar5 * auVar52._16_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 5) & 1);
                auVar66._20_4_ = (uint)bVar5 * auVar52._20_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)((byte)(uVar22 >> 6) & 1);
                auVar66._24_4_ = (uint)bVar5 * auVar52._24_4_ | (uint)!bVar5 * 0x7f800000;
                auVar66._28_4_ =
                     (uVar22 >> 7) * auVar52._28_4_ | (uint)!SUB41(uVar22 >> 7,0) * 0x7f800000;
                auVar52 = vshufps_avx(auVar66,auVar66,0xb1);
                auVar52 = vminps_avx(auVar66,auVar52);
                auVar64 = vshufpd_avx(auVar52,auVar52,5);
                auVar52 = vminps_avx(auVar52,auVar64);
                auVar64 = vpermpd_avx2(auVar52,0x4e);
                auVar52 = vminps_avx(auVar52,auVar64);
                uVar11 = vcmpps_avx512vl(auVar66,auVar52,0);
                bVar25 = (byte)uVar11 & bVar25;
                uVar26 = uVar22;
                if (bVar25 != 0) {
                  uVar26 = (uint)bVar25;
                }
                uVar87 = 0;
                for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
                  uVar87 = uVar87 + 1;
                }
              } while( true );
            }
          }
        }
        fVar88 = (ray->super_RayK<1>).tfar;
        auVar70 = ZEXT1664(CONCAT412(fVar88,CONCAT48(fVar88,CONCAT44(fVar88,fVar88))));
      }
      goto LAB_01bdd60d;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }